

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix2.c
# Opt level: O1

char * test_matrix2_rotatev3_xz_quarter_turn_opposite(void)

{
  int iVar1;
  vector2 *pvVar2;
  char *pcVar3;
  vector2 r;
  matrix2 m;
  vector2 vStack_28;
  matrix2 local_20;
  
  pvVar2 = vector2_get_reference_vector2(1);
  vector2_set(&vStack_28,pvVar2);
  matrix2_identity(&local_20);
  matrix2_rotate(&local_20,-1.5707964);
  vector2_multiplym2(&vStack_28,&local_20);
  pvVar2 = vector2_get_reference_vector2(4);
  iVar1 = vector2_equals(&vStack_28,pvVar2);
  pcVar3 = (char *)0x0;
  if (iVar1 == 0) {
    pcVar3 = 
    "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix2.c(269) : (assertion failed) ((vector2_equals(&r, vector2_get_reference_vector2(4))))"
    ;
  }
  return pcVar3;
}

Assistant:

static char *test_matrix2_rotatev3_xz_quarter_turn_opposite(void)
{
	struct matrix2 m;
	struct vector2 r;

	vector2_set(&r, HYP_VECTOR2_UNIT_X);
	matrix2_identity(&m);
	matrix2_rotate(&m, -(HYP_TAU / 4.0f));
	vector2_multiplym2(&r, &m);
	test_assert(vector2_equals(&r, HYP_VECTOR2_UNIT_Y_NEGATIVE));

	return NULL;
}